

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClass * __thiscall re2::CharClassBuilder::GetCharClass(CharClassBuilder *this)

{
  int iVar1;
  bool bVar2;
  CharClass CVar3;
  size_type sVar4;
  CharClass *pCVar5;
  reference pRVar6;
  _Self local_30;
  _Self local_28;
  iterator it;
  int n;
  CharClass *cc;
  CharClassBuilder *this_local;
  
  sVar4 = std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::size
                    (&this->ranges_);
  pCVar5 = CharClass::New((int)sVar4);
  it._M_node._4_4_ = 0;
  local_28._M_node = (_Base_ptr)begin(this);
  while( true ) {
    local_30._M_node = (_Base_ptr)end(this);
    bVar2 = std::operator!=(&local_28,&local_30);
    iVar1 = it._M_node._4_4_;
    if (!bVar2) break;
    pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator*(&local_28);
    *(RuneRange *)(*(long *)(pCVar5 + 8) + (long)it._M_node._4_4_ * 8) = *pRVar6;
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
    std::_Rb_tree_const_iterator<re2::RuneRange>::operator++(&local_28);
  }
  *(int *)(pCVar5 + 0x10) = it._M_node._4_4_;
  sVar4 = std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::size
                    (&this->ranges_);
  if (iVar1 <= (int)sVar4) {
    *(int *)(pCVar5 + 4) = this->nrunes_;
    CVar3 = (CharClass)FoldsASCII(this);
    *pCVar5 = CVar3;
    return pCVar5;
  }
  __assert_fail("(n) <= (static_cast<int>(ranges_.size()))",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                0x3a1,"CharClass *re2::CharClassBuilder::GetCharClass()");
}

Assistant:

CharClass* CharClassBuilder::GetCharClass() {
  CharClass* cc = CharClass::New(static_cast<int>(ranges_.size()));
  int n = 0;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_[n++] = *it;
  cc->nranges_ = n;
  DCHECK_LE(n, static_cast<int>(ranges_.size()));
  cc->nrunes_ = nrunes_;
  cc->folds_ascii_ = FoldsASCII();
  return cc;
}